

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O3

iterator llvm::yaml::begin<llvm::yaml::MappingNode>(MappingNode *C)

{
  iterator ret;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_10;
  
  if (C->IsAtBeginning != false) {
    C->IsAtBeginning = false;
    local_10.Base = C;
    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++
              (&local_10);
    return (iterator)local_10.Base;
  }
  __assert_fail("C.IsAtBeginning && \"You may only iterate over a collection once!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                ,0x17e,
                "typename CollectionType::iterator llvm::yaml::begin(CollectionType &) [CollectionType = llvm::yaml::MappingNode]"
               );
}

Assistant:

typename CollectionType::iterator begin(CollectionType &C) {
  assert(C.IsAtBeginning && "You may only iterate over a collection once!");
  C.IsAtBeginning = false;
  typename CollectionType::iterator ret(&C);
  ++ret;
  return ret;
}